

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::DuplicateRowsPS::DuplicateRowsPS(DuplicateRowsPS *this,DuplicateRowsPS *old)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  
  PostStep::PostStep(&this->super_PostStep,&old->super_PostStep);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__DuplicateRowsPS_00547580;
  this->m_i = old->m_i;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float
            (&(this->m_i_rowObj).m_backend,&(old->m_i_rowObj).m_backend);
  iVar1 = old->m_minRhsIdx;
  this->m_maxLhsIdx = old->m_maxLhsIdx;
  this->m_minRhsIdx = iVar1;
  bVar2 = old->m_isFirst;
  bVar3 = old->m_isLast;
  bVar4 = old->m_fixed;
  this->m_maxSense = old->m_maxSense;
  this->m_isFirst = bVar2;
  this->m_isLast = bVar3;
  this->m_fixed = bVar4;
  this->m_nCols = old->m_nCols;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&this->m_scale,&old->m_scale);
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::DSVectorBase(&this->m_rowObj,&old->m_rowObj);
  DataArray<int>::DataArray(&this->m_rIdxLocalOld,&old->m_rIdxLocalOld);
  DataArray<int>::DataArray(&this->m_perm,&old->m_perm);
  DataArray<bool>::DataArray(&this->m_isLhsEqualRhs,&old->m_isLhsEqualRhs);
  return;
}

Assistant:

DuplicateRowsPS(const DuplicateRowsPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_i_rowObj(old.m_i_rowObj)
         , m_maxLhsIdx(old.m_maxLhsIdx)
         , m_minRhsIdx(old.m_minRhsIdx)
         , m_maxSense(old.m_maxSense)
         , m_isFirst(old.m_isFirst)
         , m_isLast(old.m_isLast)
         , m_fixed(old.m_fixed)
         , m_nCols(old.m_nCols)
         , m_scale(old.m_scale)
         , m_rowObj(old.m_rowObj)
         , m_rIdxLocalOld(old.m_rIdxLocalOld)
         , m_perm(old.m_perm)
         , m_isLhsEqualRhs(old.m_isLhsEqualRhs)
      {}